

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_connection.c
# Opt level: O2

void amqp_connection_destroy(AMQP_CONNECTION_HANDLE conn_handle)

{
  if (conn_handle != (AMQP_CONNECTION_HANDLE)0x0) {
    if (conn_handle->cbs_handle != (CBS_HANDLE)0x0) {
      cbs_destroy(conn_handle->cbs_handle);
    }
    if (conn_handle->session_handle != (SESSION_HANDLE)0x0) {
      session_destroy(conn_handle->session_handle);
    }
    if (conn_handle->connection_handle != (CONNECTION_HANDLE)0x0) {
      connection_destroy(conn_handle->connection_handle);
    }
    if (conn_handle->sasl_io != (XIO_HANDLE)0x0) {
      xio_destroy(conn_handle->sasl_io);
    }
    if (conn_handle->sasl_mechanism != (SASL_MECHANISM_HANDLE)0x0) {
      saslmechanism_destroy(conn_handle->sasl_mechanism);
    }
    if (conn_handle->iothub_fqdn != (STRING_HANDLE)0x0) {
      STRING_delete(conn_handle->iothub_fqdn);
    }
    free(conn_handle);
    return;
  }
  return;
}

Assistant:

void amqp_connection_destroy(AMQP_CONNECTION_HANDLE conn_handle)
{
    if (conn_handle != NULL)
    {
        AMQP_CONNECTION_INSTANCE* instance = (AMQP_CONNECTION_INSTANCE*)conn_handle;

        if (instance->cbs_handle != NULL)
        {
            cbs_destroy(instance->cbs_handle);
        }

        if (instance->session_handle != NULL)
        {
            session_destroy(instance->session_handle);
        }

        if (instance->connection_handle != NULL)
        {
            connection_destroy(instance->connection_handle);
        }

        if (instance->sasl_io != NULL)
        {
            xio_destroy(instance->sasl_io);
        }

        if (instance->sasl_mechanism != NULL)
        {
            saslmechanism_destroy(instance->sasl_mechanism);
        }

        if (instance->iothub_fqdn != NULL)
        {
            STRING_delete(instance->iothub_fqdn);
        }

        free(instance);
    }
}